

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O3

void __thiscall Expr::ForceIDEval(Expr *this,Output *out_cc,Env *env)

{
  ExprType EVar1;
  bool bVar2;
  CaseExprList *pCVar3;
  ExprList *pEVar4;
  int i;
  pointer ppCVar5;
  long lVar6;
  pointer ppEVar7;
  
  for (; EVar1 = this->expr_type_, EVar1 == EXPR_MEMBER; this = this->operand_[0]) {
  }
  switch(EVar1) {
  case EXPR_ID:
    bVar2 = Env::Evaluated(env,this->id_);
    if (!bVar2) {
      Env::Evaluate(env,out_cc,this->id_);
      return;
    }
    break;
  case EXPR_NUM:
  case EXPR_SIZEOF:
  case EXPR_OFFSETOF:
    break;
  case EXPR_CALLARGS:
    pEVar4 = this->args_;
    if (pEVar4 != (ExprList *)0x0) {
      for (ppEVar7 = (pEVar4->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          ppEVar7 !=
          (pEVar4->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
          super__Vector_impl_data._M_finish; ppEVar7 = ppEVar7 + 1) {
        ForceIDEval(*ppEVar7,out_cc,env);
        pEVar4 = this->args_;
      }
    }
    break;
  default:
    if (EVar1 == EXPR_CASE) {
      ForceIDEval(this->operand_[0],out_cc,env);
      pCVar3 = this->cases_;
      if (pCVar3 == (CaseExprList *)0x0) {
        return;
      }
      for (ppCVar5 = (pCVar3->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          ppCVar5 !=
          (pCVar3->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
          super__Vector_impl_data._M_finish; ppCVar5 = ppCVar5 + 1) {
        ForceIDEval((*ppCVar5)->value_,out_cc,env);
        pCVar3 = this->cases_;
      }
      return;
    }
  case EXPR_CSTR:
  case EXPR_REGEX:
  case EXPR_SUBSCRIPT:
  case EXPR_MEMBER:
  case EXPR_PAREN:
  case EXPR_CALL:
    lVar6 = 0;
    do {
      if (this->operand_[lVar6] != (Expr *)0x0) {
        ForceIDEval(this->operand_[lVar6],out_cc,env);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  return;
}

Assistant:

void Expr::ForceIDEval(Output* out_cc, Env* env)
	{
	switch ( expr_type_ )
		{
		case EXPR_NUM:
		case EXPR_SIZEOF:
		case EXPR_OFFSETOF:
			break;

		case EXPR_ID:
			if ( ! env->Evaluated(id_) )
				env->Evaluate(out_cc, id_);
			break;

		case EXPR_MEMBER:
			operand_[0]->ForceIDEval(out_cc, env);
			break;

		case EXPR_CALLARGS:
			{
			foreach (i, ExprList, args_)
				(*i)->ForceIDEval(out_cc, env);
			}
			break;

		case EXPR_CASE:
			{
			operand_[0]->ForceIDEval(out_cc, env);
			foreach (i, CaseExprList, cases_)
				(*i)->value()->ForceIDEval(out_cc, env);
			}
			break;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					operand_[i]->ForceIDEval(out_cc, env);
			break;
		}
	}